

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reopen.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  time_t tVar2;
  GLFWvidmode *pGVar3;
  char *pcVar4;
  double dVar5;
  float local_148 [2];
  mat4x4 mvp;
  mat4x4 p;
  mat4x4 m;
  int local_7c;
  int local_78;
  int height_1;
  int width_1;
  float ratio;
  GLFWvidmode *mode;
  GLFWmonitor **monitors;
  GLuint local_58;
  int monitorCount;
  GLint vpos_location;
  GLint mvp_location;
  GLuint vertex_buffer;
  GLuint program;
  GLuint fragment_shader;
  GLuint vertex_shader;
  GLFWmonitor *monitor;
  int height;
  int width;
  GLFWwindow *window;
  double base;
  char **ppcStack_18;
  int count;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  base._4_4_ = 0;
  ppcStack_18 = argv;
  argv_local._0_4_ = argc;
  tVar2 = time((time_t *)0x0);
  srand((uint)tVar2);
  glfwSetErrorCallback(error_callback);
  iVar1 = glfwInit();
  if (iVar1 == 0) {
    exit(1);
  }
  glfwWindowHint(0x22002,2);
  glfwWindowHint(0x22003,0);
  while( true ) {
    _fragment_shader = (GLFWmonitor *)0x0;
    if ((base._4_4_ & 1) != 0) {
      pGVar3 = (GLFWvidmode *)glfwGetMonitors((int *)((long)&monitors + 4));
      mode = pGVar3;
      iVar1 = rand();
      _fragment_shader = *(GLFWmonitor **)(&pGVar3->width + (long)(iVar1 % monitors._4_4_) * 2);
    }
    if (_fragment_shader == (GLFWmonitor *)0x0) {
      monitor._4_4_ = 0x280;
      monitor._0_4_ = 0x1e0;
    }
    else {
      _width_1 = glfwGetVideoMode(_fragment_shader);
      monitor._4_4_ = _width_1->width;
      monitor._0_4_ = _width_1->height;
    }
    window = (GLFWwindow *)glfwGetTime();
    _height = glfwCreateWindow(monitor._4_4_,(int)monitor,"Window Re-opener",_fragment_shader,
                               (GLFWwindow *)0x0);
    if (_height == (GLFWwindow *)0x0) break;
    if (_fragment_shader == (GLFWmonitor *)0x0) {
      dVar5 = glfwGetTime();
      printf("Opening regular window took %0.3f seconds\n",dVar5 - (double)window);
    }
    else {
      pcVar4 = glfwGetMonitorName(_fragment_shader);
      dVar5 = glfwGetTime();
      printf("Opening full screen window on monitor %s took %0.3f seconds\n",dVar5 - (double)window,
             pcVar4);
    }
    glfwSetWindowCloseCallback(_height,window_close_callback);
    glfwSetKeyCallback(_height,key_callback);
    glfwMakeContextCurrent(_height);
    gladLoadGLLoader(glfwGetProcAddress);
    glfwSwapInterval(1);
    program = (*glad_glCreateShader)(0x8b31);
    (*glad_glShaderSource)(program,1,&vertex_shader_text,(GLint *)0x0);
    (*glad_glCompileShader)(program);
    vertex_buffer = (*glad_glCreateShader)(0x8b30);
    (*glad_glShaderSource)(vertex_buffer,1,&fragment_shader_text,(GLint *)0x0);
    (*glad_glCompileShader)(vertex_buffer);
    mvp_location = (*glad_glCreateProgram)();
    (*glad_glAttachShader)(mvp_location,program);
    (*glad_glAttachShader)(mvp_location,vertex_buffer);
    (*glad_glLinkProgram)(mvp_location);
    monitorCount = (*glad_glGetUniformLocation)(mvp_location,"MVP");
    local_58 = (*glad_glGetAttribLocation)(mvp_location,"vPos");
    (*glad_glGenBuffers)(1,(GLuint *)&vpos_location);
    (*glad_glBindBuffer)(0x8892,vpos_location);
    (*glad_glBufferData)(0x8892,0x20,vertices,0x88e4);
    (*glad_glEnableVertexAttribArray)(local_58);
    (*glad_glVertexAttribPointer)(local_58,2,0x1406,'\0',8,(void *)0x0);
    glfwSetTime(0.0);
    while (dVar5 = glfwGetTime(), dVar5 < 5.0) {
      glfwGetFramebufferSize(_height,&local_78,&local_7c);
      height_1 = (int)((float)local_78 / (float)local_7c);
      (*glad_glViewport)(0,0,local_78,local_7c);
      (*glad_glClear)(0x4000);
      mat4x4_ortho((vec4 *)(mvp[3] + 2),-(float)height_1,(float)height_1,-1.0,1.0,0.0,1.0);
      mat4x4_identity((vec4 *)(p[3] + 2));
      dVar5 = glfwGetTime();
      mat4x4_rotate_Z((vec4 *)(p[3] + 2),(vec4 *)(p[3] + 2),(float)dVar5);
      mat4x4_mul((vec4 *)local_148,(vec4 *)(mvp[3] + 2),(vec4 *)(p[3] + 2));
      (*glad_glUseProgram)(mvp_location);
      (*glad_glUniformMatrix4fv)(monitorCount,1,'\0',local_148);
      (*glad_glDrawArrays)(6,0,4);
      glfwSwapBuffers(_height);
      glfwPollEvents();
      iVar1 = glfwWindowShouldClose(_height);
      if (iVar1 != 0) {
        close_window(_height);
        printf("User closed window\n");
        glfwTerminate();
        exit(0);
      }
    }
    printf("Closing window\n");
    close_window(_height);
    base._4_4_ = base._4_4_ + 1;
  }
  glfwTerminate();
  exit(1);
}

Assistant:

int main(int argc, char** argv)
{
    int count = 0;
    double base;
    GLFWwindow* window;

    srand((unsigned int) time(NULL));

    glfwSetErrorCallback(error_callback);

    if (!glfwInit())
        exit(EXIT_FAILURE);

    glfwWindowHint(GLFW_CONTEXT_VERSION_MAJOR, 2);
    glfwWindowHint(GLFW_CONTEXT_VERSION_MINOR, 0);

    for (;;)
    {
        int width, height;
        GLFWmonitor* monitor = NULL;
        GLuint vertex_shader, fragment_shader, program, vertex_buffer;
        GLint mvp_location, vpos_location;

        if (count & 1)
        {
            int monitorCount;
            GLFWmonitor** monitors = glfwGetMonitors(&monitorCount);
            monitor = monitors[rand() % monitorCount];
        }

        if (monitor)
        {
            const GLFWvidmode* mode = glfwGetVideoMode(monitor);
            width = mode->width;
            height = mode->height;
        }
        else
        {
            width = 640;
            height = 480;
        }

        base = glfwGetTime();

        window = glfwCreateWindow(width, height, "Window Re-opener", monitor, NULL);
        if (!window)
        {
            glfwTerminate();
            exit(EXIT_FAILURE);
        }

        if (monitor)
        {
            printf("Opening full screen window on monitor %s took %0.3f seconds\n",
                   glfwGetMonitorName(monitor),
                   glfwGetTime() - base);
        }
        else
        {
            printf("Opening regular window took %0.3f seconds\n",
                   glfwGetTime() - base);
        }

        glfwSetWindowCloseCallback(window, window_close_callback);
        glfwSetKeyCallback(window, key_callback);

        glfwMakeContextCurrent(window);
        gladLoadGLLoader((GLADloadproc) glfwGetProcAddress);
        glfwSwapInterval(1);

        vertex_shader = glCreateShader(GL_VERTEX_SHADER);
        glShaderSource(vertex_shader, 1, &vertex_shader_text, NULL);
        glCompileShader(vertex_shader);

        fragment_shader = glCreateShader(GL_FRAGMENT_SHADER);
        glShaderSource(fragment_shader, 1, &fragment_shader_text, NULL);
        glCompileShader(fragment_shader);

        program = glCreateProgram();
        glAttachShader(program, vertex_shader);
        glAttachShader(program, fragment_shader);
        glLinkProgram(program);

        mvp_location = glGetUniformLocation(program, "MVP");
        vpos_location = glGetAttribLocation(program, "vPos");

        glGenBuffers(1, &vertex_buffer);
        glBindBuffer(GL_ARRAY_BUFFER, vertex_buffer);
        glBufferData(GL_ARRAY_BUFFER, sizeof(vertices), vertices, GL_STATIC_DRAW);

        glEnableVertexAttribArray(vpos_location);
        glVertexAttribPointer(vpos_location, 2, GL_FLOAT, GL_FALSE,
                              sizeof(vertices[0]), (void*) 0);

        glfwSetTime(0.0);

        while (glfwGetTime() < 5.0)
        {
            float ratio;
            int width, height;
            mat4x4 m, p, mvp;

            glfwGetFramebufferSize(window, &width, &height);
            ratio = width / (float) height;

            glViewport(0, 0, width, height);
            glClear(GL_COLOR_BUFFER_BIT);

            mat4x4_ortho(p, -ratio, ratio, -1.f, 1.f, 0.f, 1.f);

            mat4x4_identity(m);
            mat4x4_rotate_Z(m, m, (float) glfwGetTime());
            mat4x4_mul(mvp, p, m);

            glUseProgram(program);
            glUniformMatrix4fv(mvp_location, 1, GL_FALSE, (const GLfloat*) mvp);
            glDrawArrays(GL_TRIANGLE_FAN, 0, 4);

            glfwSwapBuffers(window);
            glfwPollEvents();

            if (glfwWindowShouldClose(window))
            {
                close_window(window);
                printf("User closed window\n");

                glfwTerminate();
                exit(EXIT_SUCCESS);
            }
        }

        printf("Closing window\n");
        close_window(window);

        count++;
    }

    glfwTerminate();
}